

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

void upb_MtDecoder_ParseMessage(upb_MtDecoder *d,char *data,size_t len)

{
  upb_Arena *puVar1;
  upb_MiniTable *puVar2;
  upb_SubCounts uVar3;
  _Bool _Var4;
  ulong uVar5;
  upb_MiniTableField *puVar6;
  upb_MiniTableField *puVar7;
  upb_MiniTableSubInternal *puVar8;
  upb_MiniTable **ppuVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  upb_SubCounts sub_counts;
  upb_SubCounts local_2c;
  
  if (len < 0x1555555555555556) {
    puVar1 = d->arena;
    uVar12 = len * 0xc + 7 & 0xfffffffffffffff8;
    puVar7 = (upb_MiniTableField *)puVar1->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)puVar7) < uVar12) {
      puVar7 = (upb_MiniTableField *)
               _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,uVar12);
    }
    else {
      if ((upb_MiniTableField *)((ulong)((long)&puVar7->presence + 1U) & 0xfffffffffffffff8) !=
          puVar7) goto LAB_003085f8;
      puVar1->ptr_dont_copy_me__upb_internal_use_only =
           (char *)((long)&puVar7->number_dont_copy_me__upb_internal_use_only + uVar12);
    }
    d->fields = puVar7;
    if (puVar7 == (upb_MiniTableField *)0x0) goto LAB_003085e7;
    local_2c.submsg_count = 0;
    local_2c.subenum_count = 0;
    puVar2 = d->table;
    puVar2->field_count_dont_copy_me__upb_internal_use_only = 0;
    puVar2->fields_dont_copy_me__upb_internal_use_only = puVar7;
    upb_MtDecoder_Parse(d,data,len,d->fields,0xc,
                        &d->table->field_count_dont_copy_me__upb_internal_use_only,&local_2c);
    puVar7 = d->fields;
    if (puVar7 == (upb_MiniTableField *)0x0) {
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x47,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
    uVar10 = d->table->field_count_dont_copy_me__upb_internal_use_only;
    if (len < uVar10) {
      __assert_fail("size <= oldsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                    ,0x48,"void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
    }
    uVar5 = (ulong)((uint)uVar10 * 0xc + 7 & 0xfffffff8);
    if (uVar5 != uVar12) {
      puVar1 = d->arena;
      if ((char *)((long)&puVar7->number_dont_copy_me__upb_internal_use_only + uVar12) ==
          puVar1->ptr_dont_copy_me__upb_internal_use_only) {
        puVar1->ptr_dont_copy_me__upb_internal_use_only =
             (char *)((long)&puVar7->number_dont_copy_me__upb_internal_use_only + uVar5);
      }
      else {
        _Var4 = _upb_Arena_WasLastAlloc(puVar1,puVar7,uVar12);
        if (!_Var4) {
          __assert_fail("_upb_Arena_WasLastAlloc(a, ptr, oldsize)",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                        ,0x58,
                        "void upb_Arena_ShrinkLast(struct upb_Arena *, void *, size_t, size_t)");
        }
      }
    }
    uVar3 = local_2c;
    d->table->fields_dont_copy_me__upb_internal_use_only = d->fields;
    uVar10 = local_2c.submsg_count;
    uVar11 = (uint)local_2c & 0xffff;
    uVar13 = ((uint)local_2c >> 0x10) + uVar11;
    uVar12 = (ulong)(uVar13 * 8);
    puVar1 = d->arena;
    puVar8 = (upb_MiniTableSubInternal *)puVar1->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)puVar8) < uVar12) {
      puVar8 = (upb_MiniTableSubInternal *)
               _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,uVar12);
    }
    else {
      if ((upb_MiniTableSubInternal *)((ulong)((long)puVar8 + 7U) & 0xfffffffffffffff8) != puVar8)
      goto LAB_003085f8;
      puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(uVar12 + (long)puVar8);
    }
    puVar1 = d->arena;
    uVar12 = (ulong)(((uint)uVar3 & 0xffff) << 3);
    ppuVar9 = (upb_MiniTable **)puVar1->ptr_dont_copy_me__upb_internal_use_only;
    if ((ulong)((long)puVar1->end_dont_copy_me__upb_internal_use_only - (long)ppuVar9) < uVar12) {
      ppuVar9 = (upb_MiniTable **)
                _upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(puVar1,uVar12);
    }
    else {
      if ((upb_MiniTable **)((ulong)((long)ppuVar9 + 7U) & 0xfffffffffffffff8) != ppuVar9) {
LAB_003085f8:
        __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mem/internal/arena.h"
                      ,0x3b,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
      }
      puVar1->ptr_dont_copy_me__upb_internal_use_only = (char *)(uVar12 + (long)ppuVar9);
    }
    if ((puVar8 != (upb_MiniTableSubInternal *)0x0) && (ppuVar9 != (upb_MiniTable **)0x0)) {
      uVar12 = 0;
      if (uVar11 != 0) {
        do {
          *ppuVar9 = &_kUpb_MiniTable_Empty_dont_copy_me__upb_internal_use_only;
          puVar8[uVar12].submsg_dont_copy_me__upb_internal_use_only = ppuVar9;
          uVar12 = uVar12 + 1;
          ppuVar9 = ppuVar9 + 1;
        } while (uVar10 != uVar12);
      }
      if (0xffff < (uint)uVar3) {
        uVar5 = (ulong)d->table->field_count_dont_copy_me__upb_internal_use_only;
        if (uVar5 != 0) {
          puVar6 = d->fields;
          puVar7 = puVar6 + uVar5;
          do {
            if (puVar6->descriptortype_dont_copy_me__upb_internal_use_only == '\x0e') {
              puVar6->submsg_index_dont_copy_me__upb_internal_use_only =
                   puVar6->submsg_index_dont_copy_me__upb_internal_use_only + uVar10;
            }
            puVar6 = puVar6 + 1;
          } while (puVar6 < puVar7);
        }
        if ((uint)uVar12 < uVar13) {
          memset(puVar8 + (uVar12 & 0xffffffff),0,(ulong)(uVar13 + ~(uint)uVar12) * 8 + 8);
        }
      }
      d->table->subs_dont_copy_me__upb_internal_use_only = puVar8;
      return;
    }
  }
LAB_003085e7:
  upb_MdDecoder_ErrorJmp(&d->base,"Out of memory");
}

Assistant:

static void upb_MtDecoder_ParseMessage(upb_MtDecoder* d, const char* data,
                                       size_t len) {
  // Buffer length is an upper bound on the number of fields. We will return
  // what we don't use.
  if (SIZE_MAX / sizeof(*d->fields) < len) {
    upb_MdDecoder_ErrorJmp(&d->base, "Out of memory");
  }
  d->fields = upb_Arena_Malloc(d->arena, sizeof(*d->fields) * len);
  upb_MdDecoder_CheckOutOfMemory(&d->base, d->fields);

  upb_SubCounts sub_counts = {0, 0};
  d->table->UPB_PRIVATE(field_count) = 0;
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_Parse(d, data, len, d->fields, sizeof(*d->fields),
                      &d->table->UPB_PRIVATE(field_count), &sub_counts);

  upb_Arena_ShrinkLast(d->arena, d->fields, sizeof(*d->fields) * len,
                       sizeof(*d->fields) * d->table->UPB_PRIVATE(field_count));
  d->table->UPB_PRIVATE(fields) = d->fields;
  upb_MtDecoder_AllocateSubs(d, sub_counts);
}